

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O1

void __thiscall
helics::apps::AsioBrokerServer::startServer
          (AsioBrokerServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *param_2)

{
  int iVar1;
  undefined1 *puVar2;
  string_view message;
  string_view message_00;
  long *local_20;
  thread local_18;
  
  puVar2 = null_abi_cxx11_;
  if (val != (json *)0x0) {
    puVar2 = (undefined1 *)val;
  }
  this->config_ = (json *)puVar2;
  if (this->tcp_enabled_ == true) {
    message._M_str = "starting tcp broker server";
    message._M_len = 0x1a;
    TypedBrokerServer::logMessage(message);
  }
  if (this->udp_enabled_ == true) {
    message_00._M_str = "starting udp broker server";
    message_00._M_len = 0x1a;
    TypedBrokerServer::logMessage(message_00);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
  if (iVar1 == 0) {
    local_18._M_id._M_thread = (id)0;
    local_20 = (long *)operator_new(0x10);
    *local_20 = (long)&PTR___State_0054ef70;
    local_20[1] = (long)this;
    std::thread::_M_start_thread(&local_18,&local_20,0);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    if ((this->mainLoopThread)._M_id._M_thread == 0) {
      (this->mainLoopThread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
      pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
      return;
    }
    std::terminate();
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void AsioBrokerServer::startServer(const nlohmann::json* val,
                                       const std::shared_ptr<TypedBrokerServer>& /*ptr*/)
    {
        config_ = (val != nullptr) ? val : &null;

        if (tcp_enabled_) {
            logMessage("starting tcp broker server");
        }
        if (udp_enabled_) {
            logMessage("starting udp broker server");
        }
        std::lock_guard<std::mutex> tlock(threadGuard);
        mainLoopThread = std::thread([this]() { mainLoop(); });
    }